

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

int xercesc_4_0::XMLString::lastIndexOf
              (XMLCh *toSearch,XMLCh ch,XMLSize_t fromIndex,MemoryManager *manager)

{
  XMLCh *pXVar1;
  XMLSize_t XVar2;
  ArrayIndexOutOfBoundsException *this;
  XMLCh *local_50;
  XMLCh *srcPtr;
  XMLSize_t len;
  MemoryManager *manager_local;
  XMLSize_t fromIndex_local;
  XMLCh ch_local;
  XMLCh *toSearch_local;
  
  XVar2 = stringLen(toSearch);
  if (XVar2 <= fromIndex) {
    this = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0x553,Str_StartIndexPastEnd,manager);
    __cxa_throw(this,&ArrayIndexOutOfBoundsException::typeinfo,
                ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
  }
  pXVar1 = toSearch + fromIndex;
  do {
    local_50 = pXVar1;
    if (local_50 < toSearch) {
      return -1;
    }
    pXVar1 = local_50 + -1;
  } while (ch != *local_50);
  return (int)((long)local_50 - (long)toSearch >> 1);
}

Assistant:

int XMLString::lastIndexOf( const   XMLCh* const    toSearch
                            , const XMLCh           ch
                            , const XMLSize_t       fromIndex
                            , MemoryManager* const  manager)
{
    const XMLSize_t len = stringLen(toSearch);
    if (fromIndex >= len) {
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Str_StartIndexPastEnd, manager);
    }

    const XMLCh* srcPtr = toSearch+fromIndex;
    while (srcPtr >= toSearch)
        if (ch == *srcPtr--)
            return (int)(srcPtr + 1 - toSearch);
    return -1;
}